

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O1

bool pbrt::ParseArg<std::__cxx11::string*>
               (char ***argv,string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  char **ppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char **ppcVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  string value;
  string arg;
  __string_type __str;
  string ret_1;
  string ret;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = out;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,**argv,(allocator<char> *)&local_f8);
  if (local_d8._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
  }
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_54::normalizeArg(&local_f8,&local_d8);
  pcVar3 = (name->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + name->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_90._M_string_length,0,'\x01');
  anon_unknown_54::normalizeArg(&local_b0,&local_90);
  if (local_f8._M_string_length < local_b0._M_string_length) {
LAB_001d5a3d:
    bVar8 = false;
  }
  else {
    bVar8 = local_b0._M_string_length == 0;
    if (!bVar8) {
      if (*local_b0._M_dataplus._M_p != *local_f8._M_dataplus._M_p) goto LAB_001d5a3d;
      uVar5 = 1;
      do {
        uVar7 = uVar5;
        if (local_b0._M_string_length == uVar7) break;
        uVar5 = uVar7 + 1;
      } while (local_b0._M_dataplus._M_p[uVar7] == local_f8._M_dataplus._M_p[uVar7]);
      bVar8 = local_b0._M_string_length <= uVar7;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    anon_unknown_54::normalizeArg(&local_f8,&local_d8);
    anon_unknown_54::normalizeArg(&local_b0,name);
    if (local_f8._M_string_length == local_b0._M_string_length) {
      if (local_f8._M_string_length == 0) {
        bVar8 = true;
      }
      else {
        iVar6 = bcmp(local_f8._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_f8._M_string_length);
        bVar8 = iVar6 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      ppcVar4 = *argv;
      ppcVar1 = ppcVar4 + 1;
      *argv = ppcVar1;
      if (ppcVar4[1] != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,*ppcVar1,(allocator<char> *)&local_b0);
        if (local_f8._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)local_b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        *argv = *argv + 1;
        bVar8 = true;
        goto LAB_001d5c96;
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_70,"missing value after %s argument",&local_d8);
      if ((onError->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*onError->_M_invoker)((_Any_data *)onError,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar8 = false;
    goto LAB_001d5c96;
  }
  *argv = *argv + 1;
  std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
  bVar8 = local_f8._M_string_length != 0;
  if (local_f8._M_string_length == 0) {
LAB_001d5ad6:
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
              (&local_50,"invalid value \"%s\" for %s argument",&local_f8,name);
    if ((onError->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*onError->_M_invoker)((_Any_data *)onError,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)local_b8);
    if (local_f8._M_string_length == 0) goto LAB_001d5ad6;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
LAB_001d5c96:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}